

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

opt_t * get_default_opt(void)

{
  opt_t *__s;
  
  __s = (opt_t *)operator_new(0xf0);
  memset(__s,0,0xf0);
  __s->mode = -1;
  __s->input = (char *)0x0;
  __s->output = (char *)0x0;
  __s->type = "crf";
  __s->algo = "l-bfgs";
  __s->pattern = (char *)0x0;
  __s->model = (char *)0x0;
  __s->devel = (char *)0x0;
  __s->rstate = (char *)0x0;
  *(undefined8 *)((long)&__s->rstate + 2) = 0;
  *(undefined8 *)((long)&__s->sstate + 2) = 0;
  __s->nthread = 1;
  __s->jobsize = 0x40;
  __s->rho1 = 0.5;
  __s->rho2 = 0.0001;
  __s->objwin = 5;
  __s->stopwin = 5;
  __s->stopeps = 0.02;
  __s->label = false;
  __s->check = false;
  __s->outsc = false;
  __s->lblpost = false;
  __s->nbest = 1;
  __s->prec = 5;
  (__s->lbfgs).clip = false;
  (__s->lbfgs).histsz = 5;
  (__s->lbfgs).maxls = 0x28;
  (__s->sgdl1).eta0 = 0.8;
  (__s->sgdl1).alpha = 0.85;
  (__s->bcd).kappa = 1.5;
  (__s->rprop).stpmin = 1e-08;
  (__s->rprop).stpmax = 50.0;
  (__s->rprop).stpinc = 1.2;
  (__s->rprop).stpdec = 0.5;
  return __s;
}

Assistant:

opt_t* get_default_opt() {
        opt_t *opt = new opt_t();

    	opt->mode    = -1;
    	opt->input   = NULL;     opt->output  = NULL;
    	opt->type    = (char *) "crf";
    	opt->maxent  = false;
    	opt->algo    = (char *) "l-bfgs"; opt->pattern = NULL;  opt->model   = NULL; opt->devel   = NULL;
    	opt->rstate  = NULL;     opt->sstate  = NULL;
    	opt->compact = false;    opt->sparse  = false;
    	opt->nthread = 1;        opt->jobsize = 64;    opt->maxiter = 0;
    	opt->rho1    = 0.5;      opt->rho2    = 0.0001;
    	opt->objwin  = 5;        opt->stopwin = 5;     opt->stopeps = 0.02;

    	opt->label   = false;    opt->check   = false; opt->outsc = false;
    	opt->lblpost = false;    opt->nbest   = 1;     opt->force = false;
    	opt->prec    = 5;
        opt->all     = false;


        opt->lbfgs.clip   = false;
        opt->lbfgs.histsz = 5;
        opt->lbfgs.maxls = 40;

        opt->sgdl1.eta0   = 0.8;
        opt->sgdl1.alpha  = 0.85;


        opt->bcd.kappa  = 1.5;

        opt->rprop.stpmin = 1e-8;
        opt->rprop.stpmax = 50.0;
        opt->rprop.stpinc = 1.2;
        opt->rprop.stpdec = 0.5,
        opt->rprop.cutoff = false;


        return opt;
    }